

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<std::complex<long_double>_>::Simetrize(TPZMatrix<std::complex<long_double>_> *this)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined8 *puVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined8 *puVar6;
  undefined4 extraout_var_00;
  
  if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
    Error("Simetrize only work for square matrices",(char *)0x0);
  }
  lVar1 = (this->super_TPZBaseMatrix).fRow;
  if (0 < lVar1) {
    lVar8 = 0;
    do {
      lVar9 = lVar8 + 1;
      for (lVar10 = lVar9; lVar10 < lVar1; lVar10 = lVar10 + 1) {
        iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                          (this,lVar8,lVar10);
        puVar6 = (undefined8 *)CONCAT44(extraout_var,iVar5);
        iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                          (this,lVar10,lVar8);
        puVar7 = (undefined8 *)CONCAT44(extraout_var_00,iVar5);
        uVar2 = puVar6[1];
        uVar3 = puVar6[2];
        uVar4 = puVar6[3];
        *puVar7 = *puVar6;
        puVar7[1] = uVar2;
        puVar7[2] = uVar3;
        puVar7[3] = uVar4;
      }
      lVar8 = lVar9;
    } while (lVar9 != lVar1);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Simetrize() {
  
  if ( Rows() != Cols() ) {
    Error( "Simetrize only work for square matrices" );
  }
  
  int64_t row,col;
  int64_t fDim1 = Rows();
  for(row=0; row<fDim1; row++) {
    for(col=row+1; col<fDim1; col++) {
      this->s(col,row) = this->s(row,col);
    }
  }
  
}